

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

void export_syms(symtbl_t *tbl)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar1 = tbl->num_syms;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      if ((tbl->syms[uVar3]->function == 0) && (tbl->scope_id == 0)) {
        fprintf((FILE *)f,".global %s\n");
        uVar1 = tbl->num_syms;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (tbl->syms[uVar3]->function == 0) {
          fprintf((FILE *)f,"%s:");
          pcVar2 = ".byte";
          if (tbl->syms[uVar3]->type_id == 0x85) {
            pcVar2 = ".word";
          }
          fprintf((FILE *)f," %s\n",pcVar2);
          uVar1 = tbl->num_syms;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar1);
    }
  }
  if (tbl->num_children != 0) {
    uVar3 = 0;
    do {
      export_syms(tbl->children[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < tbl->num_children);
  }
  return;
}

Assistant:

void export_syms(symtbl_t* tbl)
{
    unsigned int i;

    for (i = 0; i < tbl->num_syms; ++i)
    {
        if (tbl->syms[i]->function)
            continue;
        if (tbl->scope_id == 0)
            fprintf(f, ".global %s\n", tbl->syms[i]->id);
    }

    for (i = 0; i < tbl->num_syms; ++i)
    {
        if (tbl->syms[i]->function)
            continue;

        fprintf(f, "%s:", tbl->syms[i]->id);
        fprintf(f, " %s\n", tbl->syms[i]->type_id == WORD ? ".word" : ".byte");
    }

    for (i = 0; i < tbl->num_children; i++)
        export_syms(tbl->children[i]);
}